

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::Expression> __thiscall minja::Parser::parseMathPlusMinus(Parser *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  runtime_error *prVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<minja::Expression> *in_RSI;
  element_type *in_RDI;
  shared_ptr<minja::Expression> sVar5;
  Op op;
  shared_ptr<minja::Expression> right;
  string op_str;
  shared_ptr<minja::Expression> *left;
  Parser *in_stack_000000d8;
  shared_ptr<minja::BinaryOpExpr> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  element_type *__args_3;
  undefined4 in_stack_ffffffffffffff60;
  flag_type in_stack_ffffffffffffff64;
  Location *in_stack_ffffffffffffff68;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffff70;
  Parser *in_stack_ffffffffffffff78;
  __shared_ptr local_70 [16];
  string local_60 [28];
  SpaceHandling in_stack_ffffffffffffffbc;
  regex *in_stack_ffffffffffffffc0;
  Parser *in_stack_ffffffffffffffc8;
  
  __args_3 = in_RDI;
  if ((parseMathPlusMinus()::plus_minus_tok_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parseMathPlusMinus()::plus_minus_tok_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64
              );
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parseMathPlusMinus()::plus_minus_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseMathPlusMinus()::plus_minus_tok_abi_cxx11_);
  }
  parseMathMulDiv(in_stack_000000d8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
  if (bVar1) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffffc0);
    while( true ) {
      consumeToken(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      std::__cxx11::string::operator=((string *)&stack0xffffffffffffffc0,local_60);
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_60);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
        sVar5.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             extraout_RDX._M_pi;
        sVar5.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __args_3;
        return (shared_ptr<minja::Expression>)
               sVar5.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
      }
      parseMathMulDiv(in_stack_000000d8);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_70);
      if (!bVar1) break;
      std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
      get_location(in_stack_ffffffffffffff78);
      std::
      make_shared<minja::BinaryOpExpr,minja::Location,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,minja::BinaryOpExpr::Op&>
                (in_stack_ffffffffffffff68,
                 (shared_ptr<minja::Expression> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_RSI,(Op *)__args_3
                );
      std::shared_ptr<minja::Expression>::operator=
                ((shared_ptr<minja::Expression> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
      std::shared_ptr<minja::BinaryOpExpr>::~shared_ptr((shared_ptr<minja::BinaryOpExpr> *)0x2f4d0d)
      ;
      Location::~Location((Location *)0x2f4d17);
      std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2f4d21);
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Expected right side of \'math plus/minus\' expression");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"Expected left side of \'math plus/minus\' expression");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Expression> parseMathPlusMinus() {
        static std::regex plus_minus_tok(R"(\+|-(?![}%#]\}))");

        auto left = parseMathMulDiv();
        if (!left) throw std::runtime_error("Expected left side of 'math plus/minus' expression");
        std::string op_str;
        while (!(op_str = consumeToken(plus_minus_tok)).empty()) {
            auto right = parseMathMulDiv();
            if (!right) throw std::runtime_error("Expected right side of 'math plus/minus' expression");
            auto op = op_str == "+" ? BinaryOpExpr::Op::Add : BinaryOpExpr::Op::Sub;
            left = std::make_shared<BinaryOpExpr>(get_location(), std::move(left), std::move(right), op);
        }
        return left;
    }